

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_2cfb1b::BuildSystemEngineDelegate::lookupRule
          (BuildSystemEngineDelegate *this,KeyType *keyData)

{
  NodeType NVar1;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  void *pvVar4;
  long *plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  size_type sVar11;
  _Alloc_hider __p;
  Kind KVar12;
  const_iterator cVar13;
  iterator iVar14;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
  SVar15;
  BuildNode *this_00;
  BuildDescription *pBVar16;
  const_iterator cVar17;
  BuildSystemRule *pBVar18;
  __uniq_ptr_impl<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
  *this_01;
  code *pcVar19;
  KeyType *in_RDX;
  _Alloc_hider _Var20;
  _Any_data *p_Var21;
  size_type *this_02;
  StringRef SVar22;
  CommandSignature local_6e8;
  string path_1;
  undefined1 *local_6c0;
  long local_6b8;
  undefined1 local_6b0;
  undefined7 uStack_6af;
  long lStack_6a8;
  string path;
  string filters;
  BuildKey key;
  _Any_data local_638;
  code *local_628;
  code *local_620;
  _Any_data local_618;
  code *local_608;
  code *pcStack_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *pcStack_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *pcStack_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  _Any_data local_598;
  code *local_588;
  undefined8 uStack_580;
  _Any_data local_578;
  code *local_568;
  undefined8 uStack_560;
  _Any_data local_558;
  code *local_548;
  code *local_540;
  _Any_data local_538;
  code *local_528;
  undefined8 uStack_520;
  _Any_data local_518;
  code *local_508;
  undefined8 uStack_500;
  _Any_data local_4f8;
  code *local_4e8;
  undefined8 uStack_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  _Any_data local_418;
  code *local_408;
  code *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  undefined8 uStack_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  _Any_data local_198;
  code *local_188;
  undefined8 uStack_180;
  _Any_data local_178;
  code *local_168;
  undefined8 uStack_160;
  _Any_data local_158;
  code *local_148;
  undefined8 uStack_140;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  llbuild::buildsystem::BuildKey::fromData(&key,in_RDX);
  KVar12 = llbuild::buildsystem::BuildKey::getKind(&key);
  switch(KVar12) {
  case Command:
    pBVar16 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    SVar22 = llbuild::buildsystem::BuildKey::getCommandName(&key);
    cVar13 = llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
             ::find(&pBVar16->commands,SVar22);
    pBVar16 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    if (cVar13.
        super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
        .Ptr == (StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                 )((pBVar16->commands).super_StringMapImpl.TheTable +
                  (pBVar16->commands).super_StringMapImpl.NumBuckets)) {
      pBVar18 = (BuildSystemRule *)operator_new(0x90);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = path_1._M_string_length;
      path_1._0_16_ = auVar9 << 0x40;
      local_478._M_unused._M_object = (void *)0x0;
      local_478._8_8_ = 0;
      local_460 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1739:21)>
                  ::_M_invoke;
      local_468 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1739:21)>
                  ::_M_manager;
      local_498._M_unused._M_object = (void *)0x0;
      local_498._8_8_ = 0;
      local_480 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1742:22)>
                  ::_M_invoke;
      local_488 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1742:22)>
                  ::_M_manager;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      BuildSystemRule::BuildSystemRule
                (pBVar18,in_RDX,(CommandSignature *)&path_1,
                 (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_478,
                 (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_498,
                 (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &local_98);
      (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if (local_488 != (code *)0x0) {
        (*local_488)(&local_498,&local_498,__destroy_functor);
      }
      if (local_468 == (code *)0x0) goto LAB_001815bd;
      p_Var21 = &local_478;
      pcVar19 = local_468;
    }
    else {
      plVar5 = *(long **)(*(long *)cVar13.
                                   super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                   .Ptr + 8);
      pBVar18 = (BuildSystemRule *)operator_new(0x90);
      path_1._M_dataplus._M_p = (pointer)(**(code **)(*plVar5 + 0x30))(plVar5);
      local_258._8_8_ = 0;
      local_240 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1754:19)>
                  ::_M_invoke;
      local_278._8_8_ = 0;
      local_248 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1754:19)>
                  ::_M_manager;
      local_260 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1757:20)>
                  ::_M_invoke;
      local_268 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1757:20)>
                  ::_M_manager;
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1762:25)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1762:25)>
                 ::_M_manager;
      local_278._M_unused._M_object = plVar5;
      local_258._M_unused._M_object = plVar5;
      local_50._M_unused._M_object = plVar5;
      BuildSystemRule::BuildSystemRule
                (pBVar18,in_RDX,(CommandSignature *)&path_1,
                 (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_258,
                 (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_278,
                 (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &local_50);
      (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_268 != (code *)0x0) {
        (*local_268)(&local_278,&local_278,__destroy_functor);
      }
      if (local_248 == (code *)0x0) goto LAB_001815bd;
      p_Var21 = &local_258;
      pcVar19 = local_248;
    }
    break;
  case CustomTask:
    pBVar16 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    path_1._M_dataplus._M_p =
         (pointer)llvm::
                  StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
                  ::begin(&pBVar16->tools);
    uVar2 = (pBVar16->tools).super_StringMapImpl.NumBuckets;
    ppSVar3 = (pBVar16->tools).super_StringMapImpl.TheTable;
    SVar15.Ptr = (StringMapEntryBase **)path_1._M_dataplus._M_p;
    while (SVar15.Ptr != ppSVar3 + uVar2) {
      (**(code **)(*(long *)(*SVar15.Ptr)[1].StrLen + 0x30))
                (&path,(long *)(*SVar15.Ptr)[1].StrLen,&key);
      if (path._M_dataplus._M_p != (pointer)0x0) {
        std::
        vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
        ::
        emplace_back<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>
                  ((vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
                    *)(keyData + 4),
                   (unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                    *)&path);
        plVar5 = *(long **)(keyData[4].key._M_string_length - 8);
        pBVar18 = (BuildSystemRule *)operator_new(0x90);
        filters._M_dataplus._M_p = (pointer)(**(code **)(*plVar5 + 0x30))(plVar5);
        local_298._8_8_ = 0;
        local_280 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1787:21)>
                    ::_M_invoke;
        local_2b8._8_8_ = 0;
        local_288 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1787:21)>
                    ::_M_manager;
        local_2a0 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1790:22)>
                    ::_M_invoke;
        local_2a8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1790:22)>
                    ::_M_manager;
        local_70._8_8_ = 0;
        local_58 = std::
                   _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1795:27)>
                   ::_M_invoke;
        local_60 = std::
                   _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1795:27)>
                   ::_M_manager;
        local_2b8._M_unused._M_object = plVar5;
        local_298._M_unused._M_object = plVar5;
        local_70._M_unused._M_object = plVar5;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&filters,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_298,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_2b8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_70);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        if (local_2a8 != (code *)0x0) {
          (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
        }
        if (local_288 != (code *)0x0) {
          (*local_288)(&local_298,&local_298,__destroy_functor);
        }
        if (path._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)path._M_dataplus._M_p + 8))();
        }
        goto LAB_001815bd;
      }
      llvm::
      StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
      ::operator++((StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                    *)&path_1);
      SVar15.Ptr = (StringMapEntryBase **)path_1._M_dataplus._M_p;
    }
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = path_1._M_string_length;
    path_1._0_16_ = auVar6 << 0x40;
    local_4b8._M_unused._M_object = (void *)0x0;
    local_4b8._8_8_ = 0;
    local_4a0 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1808:19)>
                ::_M_invoke;
    local_4a8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1808:19)>
                ::_M_manager;
    local_4d8._M_unused._M_object = (void *)0x0;
    local_4d8._8_8_ = 0;
    local_4c0 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1811:20)>
                ::_M_invoke;
    local_4c8 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1811:20)>
                ::_M_manager;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,(CommandSignature *)&path_1,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_4b8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_4d8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_b8);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_4c8 != (code *)0x0) {
      (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
    }
    if (local_4a8 == (code *)0x0) goto LAB_001815bd;
    p_Var21 = &local_4b8;
    pcVar19 = local_4a8;
    break;
  case DirectoryContents:
    path._0_16_ = llbuild::buildsystem::BuildKey::getDirectoryPath(&key);
    llvm::StringRef::str_abi_cxx11_(&path_1,(StringRef *)&path);
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    local_6e8.value = 0;
    std::__cxx11::string::string((string *)&path,(string *)&path_1);
    local_638._8_8_ = 0;
    local_638._M_unused._M_object = operator_new(0x20);
    *(code **)local_638._M_unused._0_8_ = (code *)((long)local_638._M_unused._0_8_ + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path._M_dataplus._M_p == &path.field_2) {
      *(long *)((long)local_638._M_unused._0_8_ + 0x10) =
           CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0]);
      *(undefined8 *)((long)local_638._M_unused._0_8_ + 0x18) = path.field_2._8_8_;
    }
    else {
      *(pointer *)local_638._M_unused._0_8_ = path._M_dataplus._M_p;
      *(long *)((long)local_638._M_unused._0_8_ + 0x10) =
           CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0]);
    }
    sVar11 = path._M_string_length;
    path._M_string_length = 0;
    path._M_dataplus._M_p = (pointer)&path.field_2;
    *(size_type *)((long)local_638._M_unused._0_8_ + 8) = sVar11;
    path.field_2._M_local_buf[0] = '\0';
    local_620 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1823:19)>
                ::_M_invoke;
    local_628 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1823:19)>
                ::_M_manager;
    std::__cxx11::string::string((string *)&filters,(string *)&path_1);
    local_5b8._8_8_ = 0;
    local_5b8._M_unused._M_object = operator_new(0x20);
    sVar11 = filters._M_string_length;
    *(code **)local_5b8._M_unused._0_8_ = (code *)((long)local_5b8._M_unused._0_8_ + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filters._M_dataplus._M_p == &filters.field_2) {
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x10) =
           CONCAT71(filters.field_2._M_allocated_capacity._1_7_,filters.field_2._M_local_buf[0]);
      *(undefined8 *)((long)local_5b8._M_unused._0_8_ + 0x18) = filters.field_2._8_8_;
    }
    else {
      *(pointer *)local_5b8._M_unused._0_8_ = filters._M_dataplus._M_p;
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x10) =
           CONCAT71(filters.field_2._M_allocated_capacity._1_7_,filters.field_2._M_local_buf[0]);
    }
    filters._M_string_length = 0;
    *(size_type *)((long)local_5b8._M_unused._0_8_ + 8) = sVar11;
    filters.field_2._M_local_buf[0] = '\0';
    local_5a0 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1826:20)>
                ::_M_invoke;
    local_5a8 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1826:20)>
                ::_M_manager;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (code *)0x0;
    uStack_c0 = 0;
    filters._M_dataplus._M_p = (pointer)&filters.field_2;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,&local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_638,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_5b8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_d8);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if (local_5a8 != (code *)0x0) {
      (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
    }
    std::__cxx11::string::_M_dispose();
    if (local_628 != (code *)0x0) {
      (*local_628)(&local_638,&local_638,__destroy_functor);
    }
    std::__cxx11::string::_M_dispose();
    goto LAB_0018118a;
  case FilteredDirectoryContents:
    path_1._0_16_ = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(&key);
    llvm::StringRef::str_abi_cxx11_(&path,(StringRef *)&path_1);
    path_1._0_16_ = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&key);
    llvm::StringRef::str_abi_cxx11_(&filters,(StringRef *)&path_1);
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    local_6e8.value = 0;
    std::__cxx11::string::string((string *)&path_1,(string *)&path);
    std::__cxx11::string::string((string *)&local_6c0,(string *)&filters);
    local_5c8 = (code *)0x0;
    pcStack_5c0 = (code *)0x0;
    local_5d8._M_unused._M_object = (void *)0x0;
    local_5d8._8_8_ = 0;
    local_5d8._M_unused._M_object = operator_new(0x40);
    lVar10 = local_6b8;
    *(code **)local_5d8._M_unused._0_8_ = (code *)((long)local_5d8._M_unused._0_8_ + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path_1._M_dataplus._M_p == &path_1.field_2) {
      *(long *)((long)local_5d8._M_unused._0_8_ + 0x10) =
           CONCAT71(path_1.field_2._M_allocated_capacity._1_7_,path_1.field_2._M_local_buf[0]);
      *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 0x18) = path_1.field_2._8_8_;
    }
    else {
      *(pointer *)local_5d8._M_unused._0_8_ = path_1._M_dataplus._M_p;
      *(long *)((long)local_5d8._M_unused._0_8_ + 0x10) =
           CONCAT71(path_1.field_2._M_allocated_capacity._1_7_,path_1.field_2._M_local_buf[0]);
    }
    *(size_type *)((long)local_5d8._M_unused._0_8_ + 8) = path_1._M_string_length;
    path_1._M_string_length = 0;
    path_1._M_dataplus._M_p = (pointer)&path_1.field_2;
    path_1.field_2._M_local_buf[0] = '\0';
    *(code **)((long)local_5d8._M_unused._0_8_ + 0x20) =
         (code *)((long)local_5d8._M_unused._0_8_ + 0x30);
    if (local_6c0 == &local_6b0) {
      *(long *)((long)local_5d8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6af,local_6b0);
      *(long *)((long)local_5d8._M_unused._0_8_ + 0x38) = lStack_6a8;
    }
    else {
      *(undefined1 **)((long)local_5d8._M_unused._0_8_ + 0x20) = local_6c0;
      *(long *)((long)local_5d8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6af,local_6b0);
    }
    local_6b8 = 0;
    *(long *)((long)local_5d8._M_unused._0_8_ + 0x28) = lVar10;
    local_6b0 = 0;
    pcStack_5c0 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1840:19)>
                  ::_M_invoke;
    local_5c8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1840:19)>
                ::_M_manager;
    local_4f8._M_unused._M_object = (void *)0x0;
    local_4f8._8_8_ = 0;
    local_4e8 = (code *)0x0;
    uStack_4e0 = 0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = (code *)0x0;
    uStack_e0 = 0;
    local_6c0 = &local_6b0;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,&local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_5d8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_4f8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_f8);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (local_4e8 != (code *)0x0) {
      (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
    }
    if (local_5c8 != (code *)0x0) {
      (*local_5c8)(&local_5d8,&local_5d8,__destroy_functor);
    }
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_12::~__12((__12 *)&path_1);
    goto LAB_0018117b;
  case DirectoryTreeSignature:
    path_1._0_16_ = llbuild::buildsystem::BuildKey::getDirectoryTreeSignaturePath(&key);
    llvm::StringRef::str_abi_cxx11_(&path,(StringRef *)&path_1);
    path_1._0_16_ = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&key);
    llvm::StringRef::str_abi_cxx11_(&filters,(StringRef *)&path_1);
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    local_6e8.value = 0;
    std::__cxx11::string::string((string *)&path_1,(string *)&path);
    std::__cxx11::string::string((string *)&local_6c0,(string *)&filters);
    local_5e8 = (code *)0x0;
    pcStack_5e0 = (code *)0x0;
    local_5f8._M_unused._M_object = (void *)0x0;
    local_5f8._8_8_ = 0;
    local_5f8._M_unused._M_object = operator_new(0x40);
    lVar10 = local_6b8;
    *(code **)local_5f8._M_unused._0_8_ = (code *)((long)local_5f8._M_unused._0_8_ + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path_1._M_dataplus._M_p == &path_1.field_2) {
      *(long *)((long)local_5f8._M_unused._0_8_ + 0x10) =
           CONCAT71(path_1.field_2._M_allocated_capacity._1_7_,path_1.field_2._M_local_buf[0]);
      *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 0x18) = path_1.field_2._8_8_;
    }
    else {
      *(pointer *)local_5f8._M_unused._0_8_ = path_1._M_dataplus._M_p;
      *(long *)((long)local_5f8._M_unused._0_8_ + 0x10) =
           CONCAT71(path_1.field_2._M_allocated_capacity._1_7_,path_1.field_2._M_local_buf[0]);
    }
    *(size_type *)((long)local_5f8._M_unused._0_8_ + 8) = path_1._M_string_length;
    path_1._M_string_length = 0;
    path_1._M_dataplus._M_p = (pointer)&path_1.field_2;
    path_1.field_2._M_local_buf[0] = '\0';
    *(code **)((long)local_5f8._M_unused._0_8_ + 0x20) =
         (code *)((long)local_5f8._M_unused._0_8_ + 0x30);
    if (local_6c0 == &local_6b0) {
      *(long *)((long)local_5f8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6af,local_6b0);
      *(long *)((long)local_5f8._M_unused._0_8_ + 0x38) = lStack_6a8;
    }
    else {
      *(undefined1 **)((long)local_5f8._M_unused._0_8_ + 0x20) = local_6c0;
      *(long *)((long)local_5f8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6af,local_6b0);
    }
    local_6b8 = 0;
    *(long *)((long)local_5f8._M_unused._0_8_ + 0x28) = lVar10;
    local_6b0 = 0;
    pcStack_5e0 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1854:19)>
                  ::_M_invoke;
    local_5e8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1854:19)>
                ::_M_manager;
    local_518._M_unused._M_object = (void *)0x0;
    local_518._8_8_ = 0;
    local_508 = (code *)0x0;
    uStack_500 = 0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_6c0 = &local_6b0;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,&local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_5f8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_518,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_118);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    if (local_508 != (code *)0x0) {
      (*local_508)(&local_518,&local_518,__destroy_functor);
    }
    if (local_5e8 != (code *)0x0) {
      (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
    }
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_13::~__13((__13 *)&path_1);
    goto LAB_0018117b;
  case DirectoryTreeStructureSignature:
    path_1._0_16_ = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(&key);
    llvm::StringRef::str_abi_cxx11_(&path,(StringRef *)&path_1);
    path_1._0_16_ = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&key);
    llvm::StringRef::str_abi_cxx11_(&filters,(StringRef *)&path_1);
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    local_6e8.value = 0;
    std::__cxx11::string::string((string *)&path_1,(string *)&path);
    std::__cxx11::string::string((string *)&local_6c0,(string *)&filters);
    local_608 = (code *)0x0;
    pcStack_600 = (code *)0x0;
    local_618._M_unused._M_object = (void *)0x0;
    local_618._8_8_ = 0;
    local_618._M_unused._M_object = operator_new(0x40);
    lVar10 = local_6b8;
    *(code **)local_618._M_unused._0_8_ = (code *)((long)local_618._M_unused._0_8_ + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path_1._M_dataplus._M_p == &path_1.field_2) {
      *(long *)((long)local_618._M_unused._0_8_ + 0x10) =
           CONCAT71(path_1.field_2._M_allocated_capacity._1_7_,path_1.field_2._M_local_buf[0]);
      *(undefined8 *)((long)local_618._M_unused._0_8_ + 0x18) = path_1.field_2._8_8_;
    }
    else {
      *(pointer *)local_618._M_unused._0_8_ = path_1._M_dataplus._M_p;
      *(long *)((long)local_618._M_unused._0_8_ + 0x10) =
           CONCAT71(path_1.field_2._M_allocated_capacity._1_7_,path_1.field_2._M_local_buf[0]);
    }
    *(size_type *)((long)local_618._M_unused._0_8_ + 8) = path_1._M_string_length;
    path_1._M_string_length = 0;
    path_1._M_dataplus._M_p = (pointer)&path_1.field_2;
    path_1.field_2._M_local_buf[0] = '\0';
    *(code **)((long)local_618._M_unused._0_8_ + 0x20) =
         (code *)((long)local_618._M_unused._0_8_ + 0x30);
    if (local_6c0 == &local_6b0) {
      *(long *)((long)local_618._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6af,local_6b0);
      *(long *)((long)local_618._M_unused._0_8_ + 0x38) = lStack_6a8;
    }
    else {
      *(undefined1 **)((long)local_618._M_unused._0_8_ + 0x20) = local_6c0;
      *(long *)((long)local_618._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6af,local_6b0);
    }
    local_6b8 = 0;
    *(long *)((long)local_618._M_unused._0_8_ + 0x28) = lVar10;
    local_6b0 = 0;
    pcStack_600 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1871:19)>
                  ::_M_invoke;
    local_608 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1871:19)>
                ::_M_manager;
    local_538._M_unused._M_object = (void *)0x0;
    local_538._8_8_ = 0;
    local_528 = (code *)0x0;
    uStack_520 = 0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_128 = (code *)0x0;
    uStack_120 = 0;
    local_6c0 = &local_6b0;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,&local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_618,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_538,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_138);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (local_528 != (code *)0x0) {
      (*local_528)(&local_538,&local_538,__destroy_functor);
    }
    if (local_608 != (code *)0x0) {
      (*local_608)(&local_618,&local_618,__destroy_functor);
    }
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_14::~__14((__14 *)&path_1);
LAB_0018117b:
    std::__cxx11::string::_M_dispose();
LAB_0018118a:
    std::__cxx11::string::_M_dispose();
    goto LAB_001815bd;
  case Node:
    SVar22 = llbuild::buildsystem::BuildKey::getNodeName(&key);
    this_00 = lookupNode((BuildSystemEngineDelegate *)keyData,SVar22);
    NVar1 = this_00->type;
    if ((this_00->super_Node).producers.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->super_Node).producers.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar18 = (BuildSystemRule *)operator_new(0x90);
      if (NVar1 == Directory) {
        path_1._M_dataplus._M_p = (pointer)llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_2f8._8_8_ = 0;
        local_2e0 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1915:23)>
                    ::_M_invoke;
        local_2e8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1915:23)>
                    ::_M_manager;
        local_578._M_unused._M_object = (void *)0x0;
        local_578._8_8_ = 0;
        local_568 = (code *)0x0;
        uStack_560 = 0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        local_168 = (code *)0x0;
        uStack_160 = 0;
        local_2f8._M_unused._0_8_ = (undefined8)this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&path_1,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_2f8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_578,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_178);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_168 != (code *)0x0) {
          (*local_168)(&local_178,&local_178,__destroy_functor);
        }
        if (local_568 != (code *)0x0) {
          (*local_568)(&local_578,&local_578,__destroy_functor);
        }
        if (local_2e8 == (code *)0x0) goto LAB_001815bd;
        p_Var21 = &local_2f8;
        pcVar19 = local_2e8;
      }
      else if (NVar1 == DirectoryStructure) {
        path_1._M_dataplus._M_p = (pointer)llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_318._8_8_ = 0;
        local_300 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1928:23)>
                    ::_M_invoke;
        local_308 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1928:23)>
                    ::_M_manager;
        local_598._M_unused._M_object = (void *)0x0;
        local_598._8_8_ = 0;
        local_588 = (code *)0x0;
        uStack_580 = 0;
        local_198._M_unused._M_object = (void *)0x0;
        local_198._8_8_ = 0;
        local_188 = (code *)0x0;
        uStack_180 = 0;
        local_318._M_unused._0_8_ = (undefined8)this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&path_1,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_318,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_598,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_198);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_188 != (code *)0x0) {
          (*local_188)(&local_198,&local_198,__destroy_functor);
        }
        if (local_588 != (code *)0x0) {
          (*local_588)(&local_598,&local_598,__destroy_functor);
        }
        if (local_308 == (code *)0x0) goto LAB_001815bd;
        p_Var21 = &local_318;
        pcVar19 = local_308;
      }
      else if (NVar1 == Virtual) {
        path_1._M_dataplus._M_p = (pointer)llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_558._M_unused._M_object = (void *)0x0;
        local_558._8_8_ = 0;
        local_540 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1899:23)>
                    ::_M_invoke;
        local_548 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1899:23)>
                    ::_M_manager;
        local_2d8._8_8_ = 0;
        local_2c0 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1902:24)>
                    ::_M_invoke;
        local_2c8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1902:24)>
                    ::_M_manager;
        local_158._M_unused._M_object = (void *)0x0;
        local_158._8_8_ = 0;
        local_148 = (code *)0x0;
        uStack_140 = 0;
        local_2d8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&path_1,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_558,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_2d8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_158);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_148 != (code *)0x0) {
          (*local_148)(&local_158,&local_158,__destroy_functor);
        }
        if (local_2c8 != (code *)0x0) {
          (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
        }
        if (local_548 == (code *)0x0) goto LAB_001815bd;
        p_Var21 = &local_558;
        pcVar19 = local_548;
      }
      else {
        path_1._M_dataplus._M_p = (pointer)llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_338._8_8_ = 0;
        local_320 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1941:21)>
                    ::_M_invoke;
        local_328 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1941:21)>
                    ::_M_manager;
        local_358._8_8_ = 0;
        local_340 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1944:22)>
                    ::_M_invoke;
        local_348 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1944:22)>
                    ::_M_manager;
        local_1b8._M_unused._M_object = (void *)0x0;
        local_1b8._8_8_ = 0;
        local_1a8 = (code *)0x0;
        uStack_1a0 = 0;
        local_358._M_unused._0_8_ = (undefined8)this_00;
        local_338._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&path_1,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_338,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_358,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1b8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_1a8 != (code *)0x0) {
          (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
        }
        if (local_348 != (code *)0x0) {
          (*local_348)(&local_358,&local_358,__destroy_functor);
        }
        if (local_328 == (code *)0x0) goto LAB_001815bd;
        p_Var21 = &local_338;
        pcVar19 = local_328;
      }
    }
    else {
      pBVar18 = (BuildSystemRule *)operator_new(0x90);
      if (NVar1 == Directory) {
        path_1._M_dataplus._M_p = (pointer)llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_378._8_8_ = 0;
        local_360 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1958:21)>
                    ::_M_invoke;
        local_368 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1958:21)>
                    ::_M_manager;
        local_398._8_8_ = 0;
        local_380 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1961:22)>
                    ::_M_invoke;
        local_388 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1961:22)>
                    ::_M_manager;
        local_1d8._M_unused._M_object = (void *)0x0;
        local_1d8._8_8_ = 0;
        local_1c8 = (code *)0x0;
        uStack_1c0 = 0;
        local_398._M_unused._0_8_ = this_00;
        local_378._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&path_1,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_378,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_398,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1d8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_1c8 != (code *)0x0) {
          (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
        }
        if (local_388 != (code *)0x0) {
          (*local_388)(&local_398,&local_398,__destroy_functor);
        }
        if (local_368 == (code *)0x0) goto LAB_001815bd;
        p_Var21 = &local_378;
        pcVar19 = local_368;
      }
      else {
        path_1._M_dataplus._M_p = (pointer)llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_3b8._8_8_ = 0;
        local_3a0 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1973:19)>
                    ::_M_invoke;
        local_3a8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1973:19)>
                    ::_M_manager;
        local_3d8._8_8_ = 0;
        local_3c0 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1976:20)>
                    ::_M_invoke;
        local_3c8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1976:20)>
                    ::_M_manager;
        local_1f8._M_unused._M_object = (void *)0x0;
        local_1f8._8_8_ = 0;
        local_1e8 = (code *)0x0;
        uStack_1e0 = 0;
        local_3d8._M_unused._0_8_ = this_00;
        local_3b8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar18,in_RDX,(CommandSignature *)&path_1,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_3b8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_3d8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1f8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
        }
        if (local_3c8 != (code *)0x0) {
          (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
        }
        if (local_3a8 == (code *)0x0) goto LAB_001815bd;
        p_Var21 = &local_3b8;
        pcVar19 = local_3a8;
      }
    }
    break;
  case Stat:
    this_02 = &keyData[2].key._M_string_length;
    path._0_16_ = llbuild::buildsystem::BuildKey::getStatName(&key);
    llvm::StringRef::str_abi_cxx11_(&path_1,(StringRef *)&path);
    iVar14 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this_02,&path_1);
    std::__cxx11::string::_M_dispose();
    if (iVar14.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      path_1._0_16_ = llbuild::buildsystem::BuildKey::getStatName(&key);
      llvm::make_unique<llbuild::buildsystem::StatNode,llvm::StringRef>
                ((llvm *)&filters,(StringRef *)&path_1);
      _Var20 = filters._M_dataplus;
      path._0_16_ = llbuild::buildsystem::BuildKey::getStatName(&key);
      llvm::StringRef::str_abi_cxx11_(&path_1,(StringRef *)&path);
      this_01 = (__uniq_ptr_impl<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
                 *)std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_02,&path_1);
      __p = filters._M_dataplus;
      filters._M_dataplus._M_p = (pointer)0x0;
      std::
      __uniq_ptr_impl<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
      ::reset(this_01,(pointer)__p._M_p);
      std::__cxx11::string::_M_dispose();
      std::
      unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
      ::~unique_ptr((unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
                     *)&filters);
    }
    else {
      _Var20._M_p = *(pointer *)
                     ((long)iVar14.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                            ._M_cur + 0x28);
    }
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = path_1._M_string_length;
    path_1._0_16_ = auVar7 << 0x40;
    local_3f8._8_8_ = 0;
    local_3e0 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2000:19)>
                ::_M_invoke;
    local_3e8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2000:19)>
                ::_M_manager;
    local_418._8_8_ = 0;
    local_400 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2003:20)>
                ::_M_invoke;
    local_408 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2003:20)>
                ::_M_manager;
    local_218._M_unused._M_object = (void *)0x0;
    local_218._8_8_ = 0;
    local_208 = (code *)0x0;
    uStack_200 = 0;
    local_418._M_unused._M_object = _Var20._M_p;
    local_3f8._M_unused._M_object = _Var20._M_p;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,(CommandSignature *)&path_1,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_3f8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_418,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_218);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_208 != (code *)0x0) {
      (*local_208)(&local_218,&local_218,__destroy_functor);
    }
    if (local_408 != (code *)0x0) {
      (*local_408)(&local_418,&local_418,__destroy_functor);
    }
    if (local_3e8 == (code *)0x0) goto LAB_001815bd;
    p_Var21 = &local_3f8;
    pcVar19 = local_3e8;
    break;
  case Target:
    pBVar16 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    SVar22 = llbuild::buildsystem::BuildKey::getTargetName(&key);
    cVar17 = llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
             ::find(&pBVar16->targets,SVar22);
    pBVar16 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    if (cVar17.
        super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
        .Ptr == (StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                 )((pBVar16->targets).super_StringMapImpl.TheTable +
                  (pBVar16->targets).super_StringMapImpl.NumBuckets)) {
      __assert_fail("0 && \"FIXME: invalid target\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x7df,
                    "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                   );
    }
    pvVar4 = *(void **)(*(long *)cVar17.
                                 super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                                 .Ptr + 8);
    pBVar18 = (BuildSystemRule *)operator_new(0x90);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = path_1._M_string_length;
    path_1._0_16_ = auVar8 << 0x40;
    local_438._8_8_ = 0;
    local_420 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2024:19)>
                ::_M_invoke;
    local_428 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2024:19)>
                ::_M_manager;
    local_458._8_8_ = 0;
    local_440 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2027:20)>
                ::_M_invoke;
    local_448 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2027:20)>
                ::_M_manager;
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = 0;
    local_228 = (code *)0x0;
    uStack_220 = 0;
    local_458._M_unused._M_object = pvVar4;
    local_438._M_unused._M_object = pvVar4;
    BuildSystemRule::BuildSystemRule
              (pBVar18,in_RDX,(CommandSignature *)&path_1,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_438,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_458,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_238);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar18;
    if (local_228 != (code *)0x0) {
      (*local_228)(&local_238,&local_238,__destroy_functor);
    }
    if (local_448 != (code *)0x0) {
      (*local_448)(&local_458,&local_458,__destroy_functor);
    }
    if (local_428 == (code *)0x0) goto LAB_001815bd;
    p_Var21 = &local_438;
    pcVar19 = local_428;
    break;
  default:
    __assert_fail("0 && \"invalid key type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                  ,0x7f4,
                  "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                 );
  }
  (*pcVar19)(p_Var21,p_Var21,__destroy_functor);
LAB_001815bd:
  std::__cxx11::string::_M_dispose();
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Rule> BuildSystemEngineDelegate::lookupRule(const KeyType& keyData) {
  // Decode the key.
  auto key = BuildKey::fromData(keyData);

  switch (key.getKind()) {
  case BuildKey::Kind::Unknown:
    break;
    
  case BuildKey::Kind::Command: {
    // Find the comand.
    auto it = getBuildDescription().getCommands().find(key.getCommandName());
    if (it == getBuildDescription().getCommands().end()) {
      // If there is no such command, produce an error task.
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        /*signature=*/{},
        /*Action=*/ [](BuildEngine& engine) -> Task* {
          return new MissingCommandTask();
        },
        /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
          // The cached result for a missing command is never valid.
          return false;
        }
      ));
    }

    // Create the rule for the command.
    Command* command = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      command->getSignature(),
      /*Action=*/ [command](BuildEngine& engine) -> Task* {
        return new CommandTask(*command);
      },
      /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                             const ValueType& value) -> bool {
        return CommandTask::isResultValid(
            engine, *command, BuildValue::fromData(value));
      },
      /*UpdateStatus=*/ [command](BuildEngine& engine,
                                  core::Rule::StatusKind status) {
        return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
            command, convertStatusKind(status));
      }
    ));
  }

  case BuildKey::Kind::CustomTask: {
    // Search for a tool which knows how to create the given custom task.
    //
    // FIXME: We should most likely have some kind of registration process so we
    // can do an efficient query here, but exactly how this should look isn't
    // clear yet.
    for (const auto& it: getBuildDescription().getTools()) {
      auto result = it.second->createCustomCommand(key);
      if (!result) continue;

      // Save the custom command.
      customTasks.emplace_back(std::move(result));
      Command *command = customTasks.back().get();
      
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        command->getSignature(),
        /*Action=*/ [command](BuildEngine& engine) -> Task* {
          return new CommandTask(*command);
        },
        /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                               const ValueType& value) -> bool {
          return CommandTask::isResultValid(
              engine, *command, BuildValue::fromData(value));
        },
        /*UpdateStatus=*/ [command](BuildEngine& engine,
                                    core::Rule::StatusKind status) {
          return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
              command, convertStatusKind(status));
        }
      ));
    }
    
    // We were unable to create an appropriate custom command, produce an error
    // task.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [](BuildEngine& engine) -> Task* {
        return new MissingCommandTask();
      },
      /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
        // The cached result for a missing command is never valid.
        return false;
      }
    ));
  }

  case BuildKey::Kind::DirectoryContents: {
    std::string path = key.getDirectoryPath();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path](BuildEngine& engine) -> Task* {
        return new DirectoryContentsTask(path);
      },
      /*IsValid=*/ [path](BuildEngine& engine, const Rule& rule,
          const ValueType& value) mutable -> bool {
        return DirectoryContentsTask::isResultValid(
            engine, path, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::FilteredDirectoryContents: {
    std::string path = key.getFilteredDirectoryPath();
    std::string patterns = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, patterns](BuildEngine& engine) -> Task* {
        BinaryDecoder decoder(patterns);
        return new FilteredDirectoryContentsTask(path, StringList(decoder));
      },
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeSignature: {
    std::string path = key.getDirectoryTreeSignaturePath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeStructureSignature: {
    std::string path = key.getFilteredDirectoryPath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeStructureSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }
    
  case BuildKey::Kind::Node: {
    // Find the node.
    BuildNode* node = lookupNode(key.getNodeName());

    // Create the rule used to construct this node.
    //
    // We could bypass this level and directly return the rule to run the
    // command, which would reduce the number of tasks in the system. For now we
    // do the uniform thing, but do differentiate between input and command
    // nodes.

    // Create an input node if there are no producers.
    if (node->getProducers().empty()) {
      if (node->isVirtual()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [](BuildEngine& engine) -> Task* {
            return new VirtualInputNodeTask();
          },
          /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                                const ValueType& value) -> bool {
            return VirtualInputNodeTask::isResultValid(
                engine, *node, BuildValue::fromData(value));
          }
        ));
      }

      // DirectoryInputNodeTask
      if (node->isDirectory()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      if (node->isDirectoryStructure()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryStructureInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      // FileInputNodeTask
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new FileInputNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return FileInputNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // Otherwise, create a task for a produced node.
    // ProducedDirectoryNodeTask
    if (node->isDirectory()) {
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new ProducedDirectoryNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return ProducedDirectoryNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // ProducedNodeTask
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      node->getSignature(),
      /*Action=*/ [node](BuildEngine& engine) -> Task* {
        return new ProducedNodeTask(*node);
      },
      /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                          const ValueType& value) -> bool {
        return ProducedNodeTask::isResultValid(
            engine, *node, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::Stat: {
    StatNode* statnode;
    auto it = dynamicStatNodes.find(key.getStatName());
    if (it != dynamicStatNodes.end()) {
      statnode = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto statOwner = llvm::make_unique<StatNode>(key.getStatName());
      statnode = statOwner.get();
      dynamicStatNodes[key.getStatName()] = std::move(statOwner);
    }

    // Create the rule to construct this target.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [statnode](BuildEngine& engine) -> Task* {
        return new StatTask(*statnode);
      },
      /*IsValid=*/ [statnode](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return StatTask::isResultValid(
            engine, *statnode, BuildValue::fromData(value));
      }
    ));
  }
  case BuildKey::Kind::Target: {
    // Find the target.
    auto it = getBuildDescription().getTargets().find(key.getTargetName());
    if (it == getBuildDescription().getTargets().end()) {
      // FIXME: Invalid target name, produce an error.
      assert(0 && "FIXME: invalid target");
      abort();
    }

    // Create the rule to construct this target.
    Target* target = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [target](BuildEngine& engine) -> Task* {
        return new TargetTask(*target);
      },
      /*IsValid=*/ [target](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return TargetTask::isResultValid(
            engine, *target, BuildValue::fromData(value));
      }
    ));
  }
  }

  assert(0 && "invalid key type");
  abort();
}